

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O3

bool Js::VarIs<Js::WebAssemblySharedArrayBuffer,Js::ArrayBufferBase>(ArrayBufferBase *obj)

{
  bool bVar1;
  int iVar2;
  SharedArrayBuffer *pSVar3;
  
  bVar1 = VarIs<Js::SharedArrayBuffer,Js::RecyclableObject>((RecyclableObject *)obj);
  if (bVar1) {
    pSVar3 = UnsafeVarTo<Js::SharedArrayBuffer,Js::RecyclableObject>((RecyclableObject *)obj);
    iVar2 = (*(pSVar3->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x6d])(pSVar3);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool VarIs(U* obj)
    {
        // ChakraFull can't include type_traits, but ChakraCore does include it for debug builds
#if DBG && !defined(NTBUILD)
        static_assert(!std::is_same<T, U>::value, "Check should be unnecessary - did you prematurely cast?");
        static_assert(std::is_base_of<U, T>::value, "VarIs/VarTo should only downcast!");
#endif
        return VarIsImpl<T>(obj);
    }